

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

int __thiscall
IlmThread_2_5::anon_unknown_5::DefaultThreadPoolProvider::numThreads
          (DefaultThreadPoolProvider *this)

{
  int iVar1;
  size_type sVar2;
  long in_RDI;
  Lock lock;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  Mutex *in_stack_ffffffffffffffe8;
  Lock *in_stack_fffffffffffffff0;
  
  Lock::Lock(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
             SUB41((uint)in_stack_ffffffffffffffe4 >> 0x18,0));
  sVar2 = std::
          vector<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*,_std::allocator<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*>_>
          ::size((vector<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*,_std::allocator<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*>_>
                  *)(in_RDI + 0xc0));
  iVar1 = (int)sVar2;
  Lock::~Lock((Lock *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  return iVar1;
}

Assistant:

int
DefaultThreadPoolProvider::numThreads () const
{
    Lock lock (_data.threadMutex);
    return static_cast<int> (_data.threads.size());
}